

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Benchmark.cpp
# Opt level: O0

int anon_unknown.dwarf_26820::run_search(int argc,char **argv)

{
  char *pcVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  ostream *poVar5;
  istream *piVar6;
  ulong uVar7;
  size_type sVar8;
  undefined8 uVar9;
  reference pvVar10;
  long in_RSI;
  int in_EDI;
  double dVar11;
  undefined1 auVar12 [16];
  size_t i;
  int r;
  StopWatch sw;
  int N;
  string line;
  ifstream ifs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  keys;
  unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> dic;
  ostream *in_stack_fffffffffffffcc0;
  value_type *in_stack_fffffffffffffcc8;
  ostream *in_stack_fffffffffffffcd0;
  undefined8 in_stack_fffffffffffffcf8;
  Times type;
  pointer in_stack_fffffffffffffd00;
  ulong local_2b0;
  int local_2a4;
  StopWatch local_2a0;
  undefined4 local_294;
  string local_290 [32];
  long local_270 [63];
  string *in_stack_ffffffffffffff88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  int local_50;
  allocator local_39;
  string local_38 [40];
  long local_10;
  int local_8;
  int local_4;
  
  local_10 = in_RSI;
  local_8 = in_EDI;
  poVar5 = std::operator<<((ostream *)&std::cout,"run search");
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  if (local_8 < 4) {
    show_usage((ostream *)0x14aa3e);
    local_4 = 1;
  }
  else {
    pcVar1 = *(char **)(local_10 + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,pcVar1,&local_39);
    read_dic(in_stack_ffffffffffffff88);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
    bVar2 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                       0x14aad4);
    if (bVar2) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x14ab49);
      std::ifstream::ifstream(local_270,*(undefined8 *)(local_10 + 0x18),8);
      bVar3 = std::ios::operator!((ios *)((long)local_270 + *(long *)(local_270[0] + -0x18)));
      if ((bVar3 & 1) == 0) {
        std::__cxx11::string::string(local_290);
        std::ios_base::sync_with_stdio(false);
        while( true ) {
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)local_270,local_290);
          bVar2 = std::ios::operator_cast_to_bool
                            ((ios *)(piVar6 + *(long *)(*(long *)piVar6 + -0x18)));
          if (!bVar2) break;
          uVar7 = std::__cxx11::string::empty();
          if ((uVar7 & 1) == 0) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
          }
        }
        std::__cxx11::string::~string(local_290);
        local_50 = 0;
      }
      else {
        poVar5 = std::operator<<((ostream *)&std::cerr,"failed to open ");
        poVar5 = std::operator<<(poVar5,*(char **)(local_10 + 0x18));
        std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
        local_4 = 1;
        local_50 = 1;
      }
      std::ifstream::~ifstream(local_270);
      if (local_50 == 0) {
        local_294 = 10;
        StopWatch::StopWatch((StopWatch *)in_stack_fffffffffffffcc0);
        for (local_2a4 = 0; type = (Times)((ulong)in_stack_fffffffffffffcf8 >> 0x20), local_2a4 < 10
            ; local_2a4 = local_2a4 + 1) {
          for (local_2b0 = 0;
              sVar8 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::size(&local_68), local_2b0 < sVar8; local_2b0 = local_2b0 + 1) {
            in_stack_fffffffffffffd00 =
                 std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::operator->
                           ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
                            0x14ad8c);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&local_68,local_2b0);
            uVar9 = std::__cxx11::string::c_str();
            iVar4 = (*in_stack_fffffffffffffd00->_vptr_Dictionary[3])
                              (in_stack_fffffffffffffd00,uVar9);
            if (iVar4 == -1) {
              poVar5 = std::operator<<((ostream *)&std::cerr,"failed to search ");
              pvVar10 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](&local_68,local_2b0);
              poVar5 = std::operator<<(poVar5,(string *)pvVar10);
              std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
              local_4 = 1;
              goto LAB_0014afac;
            }
          }
        }
        poVar5 = std::operator<<((ostream *)&std::cout,"- search time: ");
        dVar11 = StopWatch::operator()((StopWatch *)in_stack_fffffffffffffd00,type);
        sVar8 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&local_68);
        auVar12._8_4_ = (int)(sVar8 >> 0x20);
        auVar12._0_8_ = sVar8;
        auVar12._12_4_ = 0x45300000;
        poVar5 = (ostream *)
                 std::ostream::operator<<
                           (poVar5,(dVar11 / ((auVar12._8_8_ - 1.9342813113834067e+25) +
                                             ((double)CONCAT44(0x43300000,(int)sVar8) -
                                             4503599627370496.0))) / 10.0);
        in_stack_fffffffffffffcd0 = std::operator<<(poVar5," us / key (on ");
        poVar5 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffcd0,10);
        in_stack_fffffffffffffcc0 = std::operator<<(poVar5," runs)");
        std::ostream::operator<<(in_stack_fffffffffffffcc0,std::endl<char,std::char_traits<char>>);
        local_4 = 0;
LAB_0014afac:
        local_50 = 1;
        StopWatch::~StopWatch(&local_2a0);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_stack_fffffffffffffcd0);
    }
    else {
      local_4 = 1;
      local_50 = 1;
    }
    std::unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_>::~unique_ptr
              ((unique_ptr<ddd::Dictionary,_std::default_delete<ddd::Dictionary>_> *)
               in_stack_fffffffffffffcc0);
  }
  return local_4;
}

Assistant:

int run_search(int argc, const char* argv[]) {
  std::cout << "run search" << std::endl;

  if (argc < 4) {
    show_usage(std::cerr);
    return 1;
  }

  auto dic = read_dic(argv[2]);
  if (!dic) {
    return 1;
  }

  std::vector<std::string> keys;
  {
    std::ifstream ifs{argv[3]};
    if (!ifs) {
      std::cerr << "failed to open " << argv[3] << std::endl;
      return 1;
    }

    std::string line;
    std::ios::sync_with_stdio(false);

    while (std::getline(ifs, line)) {
      if (!line.empty()) {
        keys.push_back(line);
      }
    }
  }

  const auto N = 10;
  StopWatch sw;

  for (int r = 0; r < N; ++r) {
    for (size_t i = 0; i < keys.size(); ++i) {
      if (dic->search_key(keys[i].c_str()) == NOT_FOUND) {
        std::cerr << "failed to search " << keys[i] << std::endl;
        return 1;
      }
    }
  }

  std::cout << "- search time: " << sw(Times::micro) / keys.size() / N
            << " us / key (on " << N << " runs)" << std::endl;

  return 0;
}